

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error texs_swizzle(context *ctx,token *token,opcode *op)

{
  int iVar1;
  opcode *in_RCX;
  token local_50;
  opcode *local_28;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  local_28 = in_RCX;
  op_local = op;
  token_local = token;
  ctx_local = ctx;
  if ((in_RCX->value >> 0x1c & 0xff) == 0xff) {
    iVar1 = equal((token *)op,"R");
    if (iVar1 == 0) {
      iVar1 = equal((token *)op_local,"G");
      if (iVar1 == 0) {
        iVar1 = equal((token *)op_local,"B");
        if (iVar1 == 0) {
          iVar1 = equal((token *)op_local,"A");
          if (iVar1 == 0) {
            iVar1 = equal((token *)op_local,"RG");
            if (iVar1 == 0) {
              iVar1 = equal((token *)op_local,"RA");
              if (iVar1 == 0) {
                iVar1 = equal((token *)op_local,"GA");
                if (iVar1 == 0) {
                  iVar1 = equal((token *)op_local,"BA");
                  if (iVar1 == 0) {
                    fail((token *)ctx,(char *)op_local,"invalid RGBA swizzle");
                    return (unique_ptr<char[],_std::default_delete<char[]>_>)
                           (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
                  }
                  opcode::add_bits(local_28,0x1c000000000000);
                }
                else {
                  opcode::add_bits(local_28,0x18000000000000);
                }
              }
              else {
                opcode::add_bits(local_28,0x14000000000000);
              }
            }
            else {
              opcode::add_bits(local_28,0x10000000000000);
            }
          }
          else {
            opcode::add_bits(local_28,0xc000000000000);
          }
        }
        else {
          opcode::add_bits(local_28,0x8000000000000);
        }
      }
      else {
        opcode::add_bits(local_28,0x4000000000000);
      }
    }
    else {
      opcode::add_bits(local_28,0);
    }
  }
  else {
    iVar1 = equal((token *)op,"RGB");
    if (iVar1 == 0) {
      iVar1 = equal((token *)op_local,"RGA");
      if (iVar1 == 0) {
        iVar1 = equal((token *)op_local,"RBA");
        if (iVar1 == 0) {
          iVar1 = equal((token *)op_local,"GBA");
          if (iVar1 == 0) {
            iVar1 = equal((token *)op_local,"RGBA");
            if (iVar1 == 0) {
              fail((token *)ctx,(char *)op_local,"invalid RGBA swizzle");
              return (unique_ptr<char[],_std::default_delete<char[]>_>)
                     (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
            }
            opcode::add_bits(local_28,0x10000000000000);
          }
          else {
            opcode::add_bits(local_28,0xc000000000000);
          }
        }
        else {
          opcode::add_bits(local_28,0x8000000000000);
        }
      }
      else {
        opcode::add_bits(local_28,0x4000000000000);
      }
    }
    else {
      opcode::add_bits(local_28,0);
    }
  }
  context::tokenize(&local_50,(context *)token_local);
  memcpy(op_local,&local_50,0x24);
  memset(ctx,0,8);
  error::error((error *)ctx);
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(texs_swizzle)
{
    if (((op.value >> 28) & 0xFF) == 0xFF) {
        if (equal(token, "R")) {
            op.add_bits(0x0000000000000000ULL);
        } else if (equal(token, "G")) {
            op.add_bits(0x0004000000000000ULL);
        } else if (equal(token, "B")) {
            op.add_bits(0x0008000000000000ULL);
        } else if (equal(token, "A")) {
            op.add_bits(0x000C000000000000ULL);
        } else if (equal(token, "RG")) {
            op.add_bits(0x0010000000000000ULL);
        } else if (equal(token, "RA")) {
            op.add_bits(0x0014000000000000ULL);
        } else if (equal(token, "GA")) {
            op.add_bits(0x0018000000000000ULL);
        } else if (equal(token, "BA")) {
            op.add_bits(0x001C000000000000ULL);
        } else {
            return fail(token, "invalid RGBA swizzle");
        }
    } else {
        if (equal(token, "RGB")) {
            op.add_bits(0x0000000000000000ULL);
        } else if (equal(token, "RGA")) {
            op.add_bits(0x0004000000000000ULL);
        } else if (equal(token, "RBA")) {
            op.add_bits(0x0008000000000000ULL);
        } else if (equal(token, "GBA")) {
            op.add_bits(0x000C000000000000ULL);
        } else if (equal(token, "RGBA")) {
            op.add_bits(0x0010000000000000ULL);
        } else {
            return fail(token, "invalid RGBA swizzle");
        }
    }
    token = ctx.tokenize();
    return {};
}